

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_CreateRaw(char *raw)

{
  uchar *puVar1;
  cJSON *item;
  char *raw_local;
  
  raw_local = (char *)cJSON_New_Item(&global_hooks);
  if ((cJSON *)raw_local != (cJSON *)0x0) {
    ((cJSON *)raw_local)->type = 0x80;
    puVar1 = cJSON_strdup((uchar *)raw,&global_hooks);
    ((cJSON *)raw_local)->valuestring = (char *)puVar1;
    if (((cJSON *)raw_local)->valuestring == (char *)0x0) {
      cJSON_Delete((cJSON *)raw_local);
      raw_local = (char *)0x0;
    }
  }
  return (cJSON *)raw_local;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_CreateRaw(const char *raw)
{
    cJSON *item = cJSON_New_Item(&global_hooks);
    if(item)
    {
        item->type = cJSON_Raw;
        item->valuestring = (char*)cJSON_strdup((const unsigned char*)raw, &global_hooks);
        if(!item->valuestring)
        {
            cJSON_Delete(item);
            return NULL;
        }
    }

    return item;
}